

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O3

LispPTR DSK_deletefile(LispPTR *args)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  FileName *varray;
  int iVar4;
  int iVar5;
  size_t sVar7;
  int *piVar8;
  DLword *pDVar9;
  char *pcVar10;
  long lVar11;
  char ver [16];
  char fbuf [4096];
  char file [4096];
  char vless [4096];
  char dir [4096];
  int local_403c;
  char local_4038 [16];
  char local_4028 [4096];
  char local_3028 [4096];
  char local_2028 [4096];
  char local_1028 [4096];
  long lVar6;
  
  iVar4 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar4 == 0) {
    uVar2 = args[1];
    if ((uVar2 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
    }
    Lisp_errno = (int *)(Lisp_world + uVar2);
    uVar2 = *args;
    if ((uVar2 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
    }
    if ((char)Lisp_world[(ulong)uVar2 + 3] == 'D') {
      iVar4 = *(int *)(Lisp_world + (ulong)uVar2 + 4) * 2 + 5;
    }
    else {
      if ((char)Lisp_world[(ulong)uVar2 + 3] != 'C') {
        error("LispStringLength: Not a character array.\n");
        goto LAB_0011d863;
      }
      iVar4 = *(int *)(Lisp_world + (ulong)uVar2 + 4) + 3;
    }
    if (iVar4 < 0x1001) {
LAB_0011d863:
      uVar2 = *args;
      if ((uVar2 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
      }
      iVar4 = *(int *)(Lisp_world + (ulong)uVar2 + 4);
      iVar5 = 0x1000;
      if (iVar4 < 0x1000) {
        iVar5 = iVar4;
      }
      lVar6 = (long)iVar5;
      if ((char)Lisp_world[(ulong)uVar2 + 3] == 'D') {
        if (iVar4 == 0) {
          pcVar10 = local_4028;
        }
        else {
          lVar6 = lVar6 + (ulong)(lVar6 == 0);
          pDVar9 = Lisp_world +
                   (ulong)Lisp_world[(ulong)uVar2 + 2] +
                   (ulong)(*(uint *)(Lisp_world + uVar2) & 0xfffffff);
          pcVar10 = local_4028;
          do {
            *pcVar10 = *(char *)((ulong)pDVar9 ^ 2);
            pcVar10 = pcVar10 + 1;
            pDVar9 = pDVar9 + 1;
            lVar6 = lVar6 + -1;
          } while (lVar6 != 0);
        }
        *pcVar10 = '\0';
      }
      else if ((char)Lisp_world[(ulong)uVar2 + 3] == 'C') {
        if (iVar4 != 0) {
          uVar3 = *(uint *)(Lisp_world + uVar2);
          uVar1 = Lisp_world[(ulong)uVar2 + 2];
          lVar11 = 0;
          do {
            local_4028[lVar11] =
                 *(char *)((long)Lisp_world + lVar11 + (ulong)uVar1 + (ulong)(uVar3 & 0xfffffff) * 2
                          ^ 3);
            lVar11 = lVar11 + 1;
          } while (lVar6 + (ulong)(lVar6 == 0) != lVar11);
        }
        local_4028[lVar6] = '\0';
      }
      else {
        error("LispStringToCString: Not a character array.\n");
      }
      unixpathname(local_4028,local_3028,1,0);
      iVar4 = unpack_filename(local_3028,local_1028,local_4028,local_4038,1);
      if (iVar4 == 0) {
        return 0;
      }
      iVar4 = get_version_array(local_1028,local_4028);
      varray = VA.files;
      if (iVar4 == 0) {
        return 0;
      }
      if ((VA.files)->version_no == 0xffffffff) {
        return 0;
      }
      strcpy(local_3028,local_4028);
      if (local_4038[0] != '\0') {
        sVar7 = strlen(local_3028);
        (local_3028 + sVar7)[0] = '.';
        (local_3028 + sVar7)[1] = '~';
        local_3028[sVar7 + 2] = '\0';
        strcat(local_3028,local_4038);
        sVar7 = strlen(local_3028);
        (local_3028 + sVar7)[0] = '~';
        (local_3028 + sVar7)[1] = '\0';
      }
      iVar4 = get_oldest(local_1028,varray,local_3028,local_4028);
      if (iVar4 == 0) {
        return 0;
      }
      iVar4 = get_versionless(VA.files,local_2028,local_1028);
      if (iVar4 == 0) {
        alarm(TIMEOUT_TIME);
        piVar8 = __errno_location();
        do {
          *piVar8 = 0;
          iVar4 = unlink(local_3028);
          if (iVar4 != -1) goto LAB_0011dba6;
        } while (*piVar8 == 4);
      }
      else {
        iVar4 = check_vless_link(local_2028,VA.files,local_4028,&local_403c);
        if (iVar4 == 0) {
          return 0;
        }
        iVar4 = strcmp(local_3028,local_2028);
        if ((iVar4 == 0) || (iVar4 = strcmp(local_3028,local_4028), iVar4 == 0)) {
          alarm(TIMEOUT_TIME);
          piVar8 = __errno_location();
          if (local_4028[0] == '\0') {
            do {
              *piVar8 = 0;
              iVar4 = unlink(local_2028);
              if (iVar4 != -1) goto LAB_0011dba6;
            } while (*piVar8 == 4);
          }
          else {
            do {
              *piVar8 = 0;
              iVar4 = unlink(local_2028);
              if (iVar4 != -1) {
                alarm(0);
                alarm(TIMEOUT_TIME);
                do {
                  *piVar8 = 0;
                  iVar4 = unlink(local_4028);
                  if (iVar4 != -1) {
                    alarm(0);
                    iVar4 = maintain_version(local_2028,0);
                    if (iVar4 != 0) {
                      return 0x4c;
                    }
                    return 0;
                  }
                } while (*piVar8 == 4);
                break;
              }
            } while (*piVar8 == 4);
          }
        }
        else {
          alarm(TIMEOUT_TIME);
          piVar8 = __errno_location();
          do {
            *piVar8 = 0;
            iVar4 = unlink(local_3028);
            if (iVar4 != -1) {
LAB_0011dba6:
              alarm(0);
              return 0x4c;
            }
          } while (*piVar8 == 4);
        }
      }
      alarm(0);
      *Lisp_errno = *piVar8;
      return 0;
    }
    *Lisp_errno = 200;
  }
  else {
    *Lisp_errno = 100;
  }
  return 0;
}

Assistant:

LispPTR DSK_deletefile(LispPTR *args)
{
  char file[MAXPATHLEN], fbuf[MAXPATHLEN], vless[MAXPATHLEN];
  char dir[MAXPATHLEN], ver[VERSIONLEN];
  int rval, fatp;
#ifdef DOS
  char drive[1], rawname[MAXNAMLEN];
  int extlen; /* len of extension, for making backup filename */
#endif        /* DOS */

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[1]);

  LispStringLength(args[0], rval, fatp);
  /*
   * Because of the version number convention, Lisp pathname might
   * be shorter than UNIX one.  For THIN string, the difference
   * is 2 bytes, for FAT string, 4 bytes.  Add 1 byte for NULL
   * terminating character.
   */
  rval = fatp ? rval + 4 + 1 : rval + 2 + 1;
  if (rval > MAXPATHLEN) FileNameTooLong(NIL);

  LispStringToCString(args[0], fbuf, MAXPATHLEN);
#ifdef DOS
  separate_drive(fbuf, drive);
  unixpathname(fbuf, file, 1, 0, drive, &extlen, rawname);
#else
  unixpathname(fbuf, file, 1, 0);
#endif

  if (unpack_filename(file, dir, fbuf, ver, 1) == 0) return (NIL);
  if (get_version_array(dir, fbuf) == 0) return (NIL);

  if (NoFileP(VA.files))
    return (NIL); /*
                   * If the specified file is deleted from
                   * outside of Lisp during the last time
                   * Lisp recognize it and now, this case
                   * will occur.
                   */

  /*
   * Although the file should have been recognized with "oldest" mode in Lisp
   * code, we have to recognize it again to know the "real" accessible name
   * of it.
   */

  ConcNameAndVersion(fbuf, ver, file);
  if (get_oldest(dir, VA.files, file, fbuf) == 0) return (NIL);

  if (get_versionless(VA.files, vless, dir) == 0) {
    /*
     * There is no versionless file.  All we have to do is to simply
     * try to unlink the specified file.
     */
    TIMEOUT(rval = unlink(file));
    if (rval == -1) {
      *Lisp_errno = errno;
      return (NIL);
    }
    return (ATOM_T);
  }

  /*
   * If a versionless file exists, we have to check the link status of it,
   * because deleting a versionless file or a file to which a versionless
   * file is linked will destroy the consistency of the version status.
   */

  if (check_vless_link(vless, VA.files, fbuf, &rval) == 0) return (NIL);

  if (strcmp(file, vless) == 0 || strcmp(file, fbuf) == 0) {
    if (*fbuf != '\0') {
      /*
       * Both of the versionless file and the file to which the
       * versionless file is linked have to be unlinked.
       */
      TIMEOUT(rval = unlink(vless));
      if (rval == -1) {
        *Lisp_errno = errno;
        return (NIL);
      }
      TIMEOUT(rval = unlink(fbuf));
      if (rval == -1) {
        *Lisp_errno = errno;
        return (NIL);
      }
      /*
       * Finally, we have to maintain the version status.
       */
      if (maintain_version(vless, 0) == 0) return (NIL);
      return (ATOM_T);
    } else {
      /*
       * Although the versionfile is specified, it is not linked
       * to any file in VA.files.  We should not maintain the version
       * status after deleting the versionless file, because
       * we cannot say whether the versionless file is actually under
       * control of the Medley DSK file system or not.
       */
      TIMEOUT(rval = unlink(vless));
      if (rval == -1) {
        *Lisp_errno = errno;
        return (NIL);
      }
      return (ATOM_T);
    }
  } else {
    /*
     * Just unlink the specified file.
     */
    TIMEOUT(rval = unlink(file));
    if (rval == -1) {
      *Lisp_errno = errno;
      return (NIL);
    }
    return (ATOM_T);
  }
}